

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void envy_bios_print_bit_M(envy_bios *bios,FILE *out,uint mask)

{
  int iVar1;
  uint local_3c;
  int i;
  int ret;
  uint16_t addr;
  char *name;
  envy_bios_mem *mem;
  FILE *pFStack_18;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  name = (char *)&bios->mem;
  if ((((envy_bios_mem *)name)->bit != (envy_bios_bit_entry *)0x0) && ((mask & 0x1000) != 0)) {
    mem._4_4_ = mask;
    pFStack_18 = (FILE *)out;
    out_local = (FILE *)bios;
    fprintf((FILE *)out,"BIT table \'M\' at 0x%x, version %i\n",
            (ulong)((envy_bios_mem *)name)->bit->offset,(ulong)((envy_bios_mem *)name)->bit->version
           );
    for (local_3c = 1; (int)local_3c < (int)(uint)*(ushort *)(*(long *)name + 6);
        local_3c = local_3c + 2) {
      iVar1 = bios_u16((envy_bios *)out_local,*(ushort *)(*(long *)name + 4) + local_3c,
                       (uint16_t *)((long)&i + 2));
      if ((iVar1 == 0) && (i._2_2_ != 0)) {
        _ret = "UNKNOWN";
        parse_at((envy_bios *)out_local,(envy_bios_mem *)name,-1,local_3c,(char **)&ret);
        fprintf(pFStack_18,"0x%02x: 0x%x => %s TABLE\n",(ulong)local_3c,(ulong)i._2_2_,_ret);
      }
    }
    fprintf(pFStack_18,"\n");
  }
  return;
}

Assistant:

void
envy_bios_print_bit_M (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_mem *mem = &bios->mem;
	const char *name;
	uint16_t addr;
	int ret = 0, i = 0;

	if (!mem->bit || !(mask & ENVY_BIOS_PRINT_MEM))
		return;

	fprintf(out, "BIT table 'M' at 0x%x, version %i\n",
			mem->bit->offset, mem->bit->version);

	for (i = 1; i < mem->bit->t_len; i+=2) {
		ret = bios_u16(bios, mem->bit->t_offset + i, &addr);
		if (!ret && addr) {
			name = "UNKNOWN";
			ret = parse_at(bios, mem, -1, i, &name);
			fprintf(out, "0x%02x: 0x%x => %s TABLE\n", i, addr, name);
		}
	}

	fprintf(out, "\n");
}